

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

bool __thiscall google::protobuf::MapKey::operator<(MapKey *this,MapKey *other)

{
  CppType CVar1;
  ulong *in_RSI;
  ulong *in_RDI;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  LogMessage *in_stack_ffffffffffffff30;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff38;
  LogLevel level;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff90;
  bool local_1;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if ((uint)in_RDI[1] != (uint)in_RSI[1]) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff40,level,(char *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff30,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogMessage::~LogMessage((LogMessage *)0x6f49ad);
  }
  CVar1 = type((MapKey *)in_stack_ffffffffffffff90);
  switch((LogMessage *)(ulong)(CVar1 - CPPTYPE_INT32)) {
  case (LogMessage *)0x0:
    local_1 = (int)(uint)*in_RDI < (int)(uint)*in_RSI;
    break;
  case (LogMessage *)0x1:
    local_1 = (long)*in_RDI < (long)*in_RSI;
    break;
  case (LogMessage *)0x2:
    local_1 = (uint)*in_RDI < (uint)*in_RSI;
    break;
  case (LogMessage *)0x3:
    local_1 = *in_RDI < *in_RSI;
    break;
  case (LogMessage *)0x4:
  case (LogMessage *)0x5:
  case (LogMessage *)0x7:
  case (LogMessage *)0x9:
    this_00 = (LogMessage *)&stack0xffffffffffffff68;
    internal::LogMessage::LogMessage
              ((LogMessage *)(ulong)(CVar1 - CPPTYPE_INT32),level,(char *)this_00,
               in_stack_ffffffffffffff2c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogMessage::~LogMessage((LogMessage *)0x6f4a56);
    local_1 = false;
    break;
  case (LogMessage *)0x6:
    local_1 = ((byte)*in_RDI & 1) < ((byte)*in_RSI & 1);
    break;
  case (LogMessage *)0x8:
    local_1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffff30,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator<(const MapKey& other) const {
    if (type_ != other.type_) {
      // We could define a total order that handles this case, but
      // there currently no need.  So, for now, fail.
      GOOGLE_LOG(FATAL) << "Unsupported: type mismatch";
    }
    switch (type()) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        return false;
      case FieldDescriptor::CPPTYPE_STRING:
        return *val_.string_value_ < *other.val_.string_value_;
      case FieldDescriptor::CPPTYPE_INT64:
        return val_.int64_value_ < other.val_.int64_value_;
      case FieldDescriptor::CPPTYPE_INT32:
        return val_.int32_value_ < other.val_.int32_value_;
      case FieldDescriptor::CPPTYPE_UINT64:
        return val_.uint64_value_ < other.val_.uint64_value_;
      case FieldDescriptor::CPPTYPE_UINT32:
        return val_.uint32_value_ < other.val_.uint32_value_;
      case FieldDescriptor::CPPTYPE_BOOL:
        return val_.bool_value_ < other.val_.bool_value_;
    }
    return false;
  }